

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O0

BreakIterator *
ustrcase_getTitleBreakIterator_63
          (Locale *locale,char *locID,uint32_t options,BreakIterator *iter,
          LocalPointer<icu_63::BreakIterator> *ownedIter,UErrorCode *errorCode)

{
  UBool UVar1;
  WholeStringBreakIterator *this;
  WholeStringBreakIterator *local_238;
  Locale local_220;
  undefined1 local_139;
  WholeStringBreakIterator *local_138;
  Locale local_120;
  UErrorCode *local_40;
  UErrorCode *errorCode_local;
  LocalPointer<icu_63::BreakIterator> *ownedIter_local;
  BreakIterator *iter_local;
  char *pcStack_20;
  uint32_t options_local;
  char *locID_local;
  Locale *locale_local;
  
  local_40 = errorCode;
  errorCode_local = (UErrorCode *)ownedIter;
  ownedIter_local = (LocalPointer<icu_63::BreakIterator> *)iter;
  iter_local._4_4_ = options;
  pcStack_20 = locID;
  locID_local = (char *)locale;
  UVar1 = U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iter_local._4_4_ = iter_local._4_4_ & 0xe0;
    if ((iter_local._4_4_ == 0) || (ownedIter_local == (LocalPointer<icu_63::BreakIterator> *)0x0))
    {
      if (ownedIter_local == (LocalPointer<icu_63::BreakIterator> *)0x0) {
        if (iter_local._4_4_ == 0) {
          if (locID_local == (char *)0x0) {
            icu_63::Locale::Locale(&local_120,pcStack_20,(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            icu_63::Locale::Locale(&local_120,(Locale *)locID_local);
          }
          ownedIter_local =
               (LocalPointer<icu_63::BreakIterator> *)
               icu_63::BreakIterator::createWordInstance(&local_120,local_40);
          icu_63::Locale::~Locale(&local_120);
        }
        else if (iter_local._4_4_ == 0x20) {
          this = (WholeStringBreakIterator *)
                 icu_63::UMemory::operator_new((UMemory *)0x148,(size_t)locID);
          local_139 = 0;
          local_238 = (WholeStringBreakIterator *)0x0;
          if (this != (WholeStringBreakIterator *)0x0) {
            local_139 = 1;
            local_138 = this;
            icu_63::WholeStringBreakIterator::WholeStringBreakIterator(this);
            local_238 = this;
          }
          ownedIter_local = (LocalPointer<icu_63::BreakIterator> *)local_238;
          if (local_238 == (WholeStringBreakIterator *)0x0) {
            *local_40 = U_MEMORY_ALLOCATION_ERROR;
          }
        }
        else if (iter_local._4_4_ == 0x40) {
          if (locID_local == (char *)0x0) {
            icu_63::Locale::Locale(&local_220,pcStack_20,(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            icu_63::Locale::Locale(&local_220,(Locale *)locID_local);
          }
          ownedIter_local =
               (LocalPointer<icu_63::BreakIterator> *)
               icu_63::BreakIterator::createSentenceInstance(&local_220,local_40);
          icu_63::Locale::~Locale(&local_220);
        }
        else {
          *local_40 = U_ILLEGAL_ARGUMENT_ERROR;
        }
        icu_63::LocalPointer<icu_63::BreakIterator>::adoptInstead
                  ((LocalPointer<icu_63::BreakIterator> *)errorCode_local,
                   (BreakIterator *)ownedIter_local);
      }
      locale_local = (Locale *)ownedIter_local;
    }
    else {
      *local_40 = U_ILLEGAL_ARGUMENT_ERROR;
      locale_local = (Locale *)0x0;
    }
  }
  else {
    locale_local = (Locale *)0x0;
  }
  return (BreakIterator *)locale_local;
}

Assistant:

U_CFUNC
BreakIterator *ustrcase_getTitleBreakIterator(
        const Locale *locale, const char *locID, uint32_t options, BreakIterator *iter,
        LocalPointer<BreakIterator> &ownedIter, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return nullptr; }
    options &= U_TITLECASE_ITERATOR_MASK;
    if (options != 0 && iter != nullptr) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }
    if (iter == nullptr) {
        switch (options) {
        case 0:
            iter = BreakIterator::createWordInstance(
                locale != nullptr ? *locale : Locale(locID), errorCode);
            break;
        case U_TITLECASE_WHOLE_STRING:
            iter = new WholeStringBreakIterator();
            if (iter == nullptr) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
            }
            break;
        case U_TITLECASE_SENTENCES:
            iter = BreakIterator::createSentenceInstance(
                locale != nullptr ? *locale : Locale(locID), errorCode);
            break;
        default:
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            break;
        }
        ownedIter.adoptInstead(iter);
    }
    return iter;
}